

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc-posix.c
# Opt level: O1

unsigned_short * mi_wcsdup(unsigned_short *s)

{
  short *psVar1;
  unsigned_short *puVar2;
  size_t size;
  
  if (s == (unsigned_short *)0x0) {
    puVar2 = (unsigned_short *)0x0;
  }
  else {
    size = 0;
    do {
      psVar1 = (short *)((long)s + size);
      size = size + 2;
    } while (*psVar1 != 0);
    puVar2 = (unsigned_short *)mi_malloc(size);
    if (puVar2 != (unsigned_short *)0x0) {
      puVar2 = (unsigned_short *)memcpy(puVar2,s,size);
      return puVar2;
    }
  }
  return puVar2;
}

Assistant:

unsigned short* mi_wcsdup(const unsigned short* s) mi_attr_noexcept {
  if (s==NULL) return NULL;
  size_t len;
  for(len = 0; s[len] != 0; len++) { }
  size_t size = (len+1)*sizeof(unsigned short);
  unsigned short* p = (unsigned short*)mi_malloc(size);
  if (p != NULL) {
    _mi_memcpy(p,s,size);
  }
  return p;
}